

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O2

int __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::ComputePriority(MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  *this,CornerIndex corner_id)

{
  pointer piVar1;
  const_reference cVar2;
  int iVar3;
  size_type __n;
  
  if (corner_id.value_ == 0xffffffff) {
    __n = 0xffffffff;
  }
  else {
    __n = (size_type)
          (((this->
            super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ).corner_table_)->corner_to_vertex_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[corner_id.value_].value_;
  }
  cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&(this->
                      super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                      ).is_vertex_visited_,__n);
  iVar3 = 0;
  if (!cVar2) {
    piVar1 = (this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar3 = piVar1[__n];
    piVar1[__n] = iVar3 + 1;
    iVar3 = (iVar3 < 1) + 1;
  }
  return iVar3;
}

Assistant:

inline int ComputePriority(CornerIndex corner_id) {
    const VertexIndex v_tip = this->corner_table()->Vertex(corner_id);
    // Priority 0 when traversing to already visited vertices.
    int priority = 0;
    if (!this->IsVertexVisited(v_tip)) {
      const int degree = ++prediction_degree_[v_tip];
      // Priority 1 when prediction degree > 1, otherwise 2.
      priority = (degree > 1 ? 1 : 2);
    }
    // Clamp the priority to the maximum number of buckets.
    if (priority >= kMaxPriority) {
      priority = kMaxPriority - 1;
    }
    return priority;
  }